

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
PreventExtensions(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                  *this,DynamicObject *instance)

{
  int *piVar1;
  byte bVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  BOOL BVar3;
  int iVar4;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar5;
  undefined8 extraout_RDX;
  
  bVar2 = (this->super_DynamicTypeHandler).flags;
  if ((bVar2 & 1) == 0) {
    return 1;
  }
  if ((bVar2 & 4) == 0) {
    BVar3 = PreventExtensionsInternal(this,instance);
    return BVar3;
  }
  pDVar5 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>,Js::PropertyRecord_const*>
                     ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>
                       *)this,instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar5->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36];
  iVar4 = (*UNRECOVERED_JUMPTABLE)(pDVar5,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar4;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensions(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if ((this->GetFlags() & IsExtensibleFlag) == 0)
            {
                // Already not extensible => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked())
            {
                // If the type is not shared with others, we can just change it by itself.
                return PreventExtensionsInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }